

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,
          tag_t<cfgfile::string_trait_t> *parent,child_tags_list_t *list)

{
  pointer pptVar1;
  pointer pptVar2;
  bool bVar3;
  exception_t<cfgfile::string_trait_t> *this_00;
  pos_t pos;
  bool bVar4;
  pointer pptVar5;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  lexeme_t<cfgfile::string_trait_t> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string_t local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(&local_198,&this->m_lex);
  pptVar1 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pptVar1 != pptVar2) {
    bVar4 = false;
    do {
      pptVar5 = pptVar1 + 1;
      bVar3 = start_tag_parsing(this,&local_198,*pptVar1);
      if (bVar3) {
        bVar4 = true;
      }
      pptVar1 = pptVar5;
    } while (pptVar5 != pptVar2 && !bVar3);
    if (bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198.m_value._M_dataplus._M_p != &local_198.m_value.field_2) {
        operator_delete(local_198.m_value._M_dataplus._M_p,
                        local_198.m_value.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Unexpected tag name. We expected one child tag of tag \"","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_1b8,local_1b8 + local_1b0);
  std::operator+(&local_130,&local_170,&parent->m_name);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\", but we\'ve got \"","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_1f8,local_1f8 + local_1f0);
  std::operator+(&local_110,&local_130,&local_1d8);
  std::operator+(&local_f0,&local_110,&local_198.m_value);
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"\". In file \"","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_218,local_278,local_278 + local_270);
  std::operator+(&local_d0,&local_f0,&local_218);
  std::operator+(&local_b0,&local_d0,&((this->m_lex).m_stream)->m_file_name);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"\" on line ","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_298,local_298 + local_290);
  std::operator+(&local_90,&local_b0,&local_238);
  string_trait_t::to_string_abi_cxx11_(&local_150,(string_trait_t *)(this->m_lex).m_line_number,pos)
  ;
  std::operator+(&local_70,&local_90,&local_150);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,".","");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_258,local_2b8,local_2b8 + local_2b0);
  std::operator+(&local_50,&local_70,&local_258);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
  __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void start_tag_parsing( const tag_t< Trait > & parent,
		const typename tag_t< Trait >::child_tags_list_t & list )
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		bool tag_found = false;

		for( tag_t< Trait > * tag : list )
		{
			if( start_tag_parsing( lexeme, *tag ) )
			{
				tag_found = true;

				break;
			}
		}

		if( !tag_found )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected one child tag of tag \"" ) +
				parent.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
	}